

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GSPriorityFloodClass.cpp
# Opt level: O0

XY_t __thiscall
GSFloodFill<unsigned_char>::miNeighbors
          (GSFloodFill<unsigned_char> *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *neighbors)

{
  uchar **ppuVar1;
  uchar *puVar2;
  byte bVar3;
  bool bVar4;
  pointer ppVar5;
  reference __p;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_40;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_38;
  iterator it;
  double local_28;
  Real mindem;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *neighbors_local;
  GSFloodFill<unsigned_char> *this_local;
  XY_t minxy;
  
  bVar3 = std::numeric_limits<unsigned_char>::max();
  local_28 = (double)bVar3;
  it._M_current._4_4_ = 0xffffffff;
  it._M_current._0_4_ = 0xffffffff;
  std::pair<int,_int>::pair<int,_int,_true>
            ((pair<int,_int> *)&this_local,(int *)((long)&it._M_current + 4),(int *)&it);
  local_38._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(neighbors);
  while( true ) {
    local_40._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(neighbors);
    bVar4 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar4) break;
    ppuVar1 = this->dem;
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_38);
    puVar2 = ppuVar1[ppVar5->first];
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_38);
    if ((double)puVar2[ppVar5->second] < local_28) {
      ppuVar1 = this->dem;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_38);
      puVar2 = ppuVar1[ppVar5->first];
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_38);
      local_28 = (double)puVar2[ppVar5->second];
      __p = __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator*(&local_38);
      std::pair<int,_int>::operator=((pair<int,_int> *)&this_local,__p);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_38,0);
  }
  return (XY_t)this_local;
}

Assistant:

XY_t GSFloodFill<T>::miNeighbors(vector<XY_t> neighbors) {
	Real mindem = std::numeric_limits<T>::max();
	XY_t minxy = pair<int,int>(-1,-1);
	
	for (vector<XY_t>::iterator it = neighbors.begin(); it != neighbors.end(); it++) {
		if (dem[it->first][it->second] < mindem) {
			mindem = dem[it->first][it->second];
			minxy = *it;
		}
	}
	return minxy;
}